

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_test.cc
# Opt level: O2

void re2::SingleThreadedSearchDFA(void)

{
  Regexp *this;
  Prog *this_00;
  int extraout_EDX;
  int extraout_EDX_00;
  char *this_01;
  int iVar1;
  bool bVar2;
  bool failed;
  StringPiece local_200;
  string no_match;
  string match;
  LogMessageFatal local_1b0;
  
  StringPrintf_abi_cxx11_((string *)&local_1b0,"0[01]{%d}$",0x12);
  no_match._M_dataplus._M_p = (pointer)local_1b0.super_LogMessage._0_8_;
  no_match._M_string_length._0_4_ = local_1b0.super_LogMessage._8_4_;
  this_01 = (char *)0x794;
  this = Regexp::Parse((StringPiece *)&no_match,LikePerl,(RegexpStatus *)0x0);
  std::__cxx11::string::~string((string *)&local_1b0);
  iVar1 = extraout_EDX;
  if (this == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
               ,0xbe);
    this_01 = "Check failed: re";
    std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Check failed: re");
    LogMessageFatal::~LogMessageFatal(&local_1b0);
    iVar1 = extraout_EDX_00;
  }
  DeBruijnString_abi_cxx11_(&no_match,(re2 *)this_01,iVar1);
  std::operator+(&match,&no_match,"0");
  FLAGS_re2_dfa_bail_when_slow = 0;
  this_00 = Regexp::CompileToProg(this,0x40000);
  if (this_00 == (Prog *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
               ,0xd2);
    std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Check failed: prog");
    LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
  iVar1 = 10;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    failed = false;
    local_1b0.super_LogMessage._0_8_ = match._M_dataplus._M_p;
    local_200.ptr_ = (char *)0x0;
    local_1b0.super_LogMessage._8_4_ = (int)match._M_string_length;
    local_200.length_ = 0;
    bVar2 = Prog::SearchDFA(this_00,(StringPiece *)&local_1b0,&local_200,kUnanchored,kFirstMatch,
                            (StringPiece *)0x0,&failed,(vector<int,_std::allocator<int>_> *)0x0);
    if (failed != false) {
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0xd8);
      std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Check failed: !failed");
      LogMessageFatal::~LogMessageFatal(&local_1b0);
    }
    if (!bVar2) {
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0xd9);
      std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Check failed: matched");
      LogMessageFatal::~LogMessageFatal(&local_1b0);
    }
    local_1b0.super_LogMessage._0_8_ = no_match._M_dataplus._M_p;
    local_200.ptr_ = (char *)0x0;
    local_1b0.super_LogMessage._8_4_ = (int)no_match._M_string_length;
    local_200.length_ = 0;
    bVar2 = Prog::SearchDFA(this_00,(StringPiece *)&local_1b0,&local_200,kUnanchored,kFirstMatch,
                            (StringPiece *)0x0,&failed,(vector<int,_std::allocator<int>_> *)0x0);
    if (failed != false) {
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0xdd);
      std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Check failed: !failed");
      LogMessageFatal::~LogMessageFatal(&local_1b0);
    }
    if (bVar2) {
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dfa_test.cc"
                 ,0xde);
      std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Check failed: !matched");
      LogMessageFatal::~LogMessageFatal(&local_1b0);
    }
  }
  if (this_00 != (Prog *)0x0) {
    Prog::~Prog(this_00);
  }
  operator_delete(this_00);
  std::__cxx11::string::~string((string *)&match);
  std::__cxx11::string::~string((string *)&no_match);
  return;
}

Assistant:

TEST(SingleThreaded, SearchDFA) {
  // Choice of n is mostly arbitrary, except that:
  //   * making n too big makes the test run for too long.
  //   * making n too small makes the DFA refuse to run,
  //     because it has so little memory compared to the program size.
  // Empirically, n = 18 is a good compromise between the two.
  const int n = 18;

  Regexp* re = Regexp::Parse(StringPrintf("0[01]{%d}$", n),
                             Regexp::LikePerl, NULL);
  CHECK(re);

  // The De Bruijn string for n ends with a 1 followed by n 0s in a row,
  // which is not a match for 0[01]{n}$.  Adding one more 0 is a match.
  string no_match = DeBruijnString(n);
  string match = no_match + "0";

  // The De Bruijn string is the worst case input for this regexp.
  // By default, the DFA will notice that it is flushing its cache
  // too frequently and will bail out early, so that RE2 can use the
  // NFA implementation instead.  (The DFA loses its speed advantage
  // if it can't get a good cache hit rate.)
  // Tell the DFA to trudge along instead.
  FLAGS_re2_dfa_bail_when_slow = false;

  int64 usage;
  int64 peak_usage;
  {
    testing::MallocCounter m(testing::MallocCounter::THIS_THREAD_ONLY);
    Prog* prog = re->CompileToProg(1<<n);
    CHECK(prog);
    for (int i = 0; i < 10; i++) {
      bool matched, failed = false;
      matched = prog->SearchDFA(match, NULL,
                                Prog::kUnanchored, Prog::kFirstMatch,
                                NULL, &failed, NULL);
      CHECK(!failed);
      CHECK(matched);
      matched = prog->SearchDFA(no_match, NULL,
                                Prog::kUnanchored, Prog::kFirstMatch,
                                NULL, &failed, NULL);
      CHECK(!failed);
      CHECK(!matched);
    }
    usage = m.HeapGrowth();
    peak_usage = m.PeakHeapGrowth();
    delete prog;
  }
  if (!UsingMallocCounter)
    return;
  //LOG(INFO) << "usage " << usage << ", "
  //          << "peak usage " << peak_usage;
  CHECK_LT(usage, 1<<n);
  CHECK_LT(peak_usage, 1<<n);
  re->Decref();
}